

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1373::run(TestCase1373 *this)

{
  uint index;
  bool bVar1;
  uint uVar2;
  Orphan<capnp::Text> *pOVar3;
  uchar *puVar4;
  char *params_1;
  __off_t __length;
  Orphanage OVar5;
  BuilderFor<capnp::Data> BVar6;
  Reader RVar7;
  ArrayPtr<const_char> AVar8;
  ArrayPtr<const_unsigned_char> AVar9;
  ArrayPtr<const_unsigned_char> local_358;
  int local_348;
  bool local_341;
  undefined1 auStack_340 [7];
  bool _kj_shouldLog_5;
  size_t local_338;
  ArrayPtr<const_char> local_330;
  bool local_319;
  undefined1 auStack_318 [7];
  bool _kj_shouldLog_4;
  size_t local_310;
  ArrayPtr<const_char> local_308;
  bool local_2f1;
  undefined1 auStack_2f0 [7];
  bool _kj_shouldLog_3;
  size_t local_2e8;
  uint local_2e0;
  bool local_2d9;
  uint i_3;
  bool _kj_shouldLog_2;
  ArrayPtr<const_char> local_2c0;
  String local_2b0;
  bool local_291;
  undefined1 auStack_290 [7];
  bool _kj_shouldLog_1;
  size_t local_288;
  String local_280;
  char local_268 [4];
  uint local_264;
  uint i_2;
  bool local_259;
  undefined1 local_258 [7];
  bool _kj_shouldLog;
  ReaderFor<capnp::List<capnp::Text,_(capnp::Kind)1>_> reader;
  Orphanage local_218;
  undefined1 local_208 [8];
  Orphan<capnp::Data> orphan2;
  undefined1 local_1e0 [4];
  uint i_1;
  BuilderFor<capnp::List<capnp::Text,_(capnp::Kind)1>_> builder;
  undefined1 local_1a8 [8];
  Orphan<capnp::List<capnp::Text,_(capnp::Kind)1>_> orphan;
  ArrayPtr<const_char> local_170;
  Orphanage local_160;
  Orphan<capnp::Text> local_150;
  char local_130 [2] [4];
  uint i;
  undefined1 local_120 [8];
  Vector<capnp::Orphan<capnp::Text>_> pointers;
  MallocMessageBuilder message;
  TestCase1373 *this_local;
  
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&pointers.builder.disposer,0x400,GROW_HEURISTICALLY);
  kj::Vector<capnp::Orphan<capnp::Text>_>::Vector
            ((Vector<capnp::Orphan<capnp::Text>_> *)local_120,7);
  local_130[0][0] = '\0';
  local_130[0][1] = '\0';
  local_130[0][2] = '\0';
  local_130[0][3] = '\0';
  for (; (uint)local_130[0] < 7; local_130[0] = (char  [4])((int)local_130[0] + 1)) {
    OVar5 = MessageBuilder::getOrphanage((MessageBuilder *)&pointers.builder.disposer);
    local_160 = OVar5;
    kj::str<char_const(&)[4],unsigned_int&>
              ((String *)&orphan.builder.location,(kj *)"foo",local_130,(uint *)OVar5.arena);
    Text::Reader::Reader((Reader *)&local_170,(String *)&orphan.builder.location);
    Orphanage::newOrphanCopy<capnp::Text::Reader>(&local_150,&local_160,(Reader)local_170);
    kj::Vector<capnp::Orphan<capnp::Text>>::add<capnp::Orphan<capnp::Text>>
              ((Vector<capnp::Orphan<capnp::Text>> *)local_120,&local_150);
    Orphan<capnp::Text>::~Orphan(&local_150);
    kj::String::~String((String *)&orphan.builder.location);
  }
  OVar5 = MessageBuilder::getOrphanage((MessageBuilder *)&pointers.builder.disposer);
  builder.builder._32_8_ = OVar5.arena;
  Orphanage::newOrphan<capnp::List<capnp::Text,(capnp::Kind)1>>
            ((Orphan<capnp::List<capnp::Text,_(capnp::Kind)1>_> *)local_1a8,
             (Orphanage *)&builder.builder.structDataSize,7);
  Orphan<capnp::List<capnp::Text,_(capnp::Kind)1>_>::get
            ((BuilderFor<capnp::List<capnp::Text,_(capnp::Kind)1>_> *)local_1e0,
             (Orphan<capnp::List<capnp::Text,_(capnp::Kind)1>_> *)local_1a8);
  for (orphan2.builder.location._4_4_ = 0; index = orphan2.builder.location._4_4_,
      orphan2.builder.location._4_4_ < 7;
      orphan2.builder.location._4_4_ = orphan2.builder.location._4_4_ + 1) {
    pOVar3 = kj::Vector<capnp::Orphan<capnp::Text>_>::operator[]
                       ((Vector<capnp::Orphan<capnp::Text>_> *)local_120,
                        (ulong)orphan2.builder.location._4_4_);
    pOVar3 = kj::mv<capnp::Orphan<capnp::Text>>(pOVar3);
    List<capnp::Text,_(capnp::Kind)1>::Builder::adopt((Builder *)local_1e0,index,pOVar3);
  }
  local_218 = MessageBuilder::getOrphanage((MessageBuilder *)&pointers.builder.disposer);
  Orphanage::newOrphan<capnp::Data>((Orphan<capnp::Data> *)local_208,&local_218,1);
  BVar6 = Orphan<capnp::Data>::get((Orphan<capnp::Data> *)local_208);
  reader.reader._40_8_ = BVar6.super_ArrayPtr<unsigned_char>.ptr;
  puVar4 = kj::ArrayPtr<unsigned_char>::operator[]
                     ((ArrayPtr<unsigned_char> *)&reader.reader.nestingLimit,0);
  *puVar4 = ' ';
  Orphan<capnp::List<capnp::Text,_(capnp::Kind)1>_>::truncate
            ((Orphan<capnp::List<capnp::Text,_(capnp::Kind)1>_> *)local_1a8,(char *)0xb,__length);
  Orphan<capnp::List<capnp::Text,_(capnp::Kind)1>_>::getReader
            ((ReaderFor<capnp::List<capnp::Text,_(capnp::Kind)1>_> *)local_258,
             (Orphan<capnp::List<capnp::Text,_(capnp::Kind)1>_> *)local_1a8);
  uVar2 = List<capnp::Text,_(capnp::Kind)1>::Reader::size((Reader *)local_258);
  params_1 = (char *)(ulong)uVar2;
  if (uVar2 != 0xb) {
    local_259 = kj::_::Debug::shouldLog(ERROR);
    while (local_259 != false) {
      i_2 = 0xb;
      local_264 = List<capnp::Text,_(capnp::Kind)1>::Reader::size((Reader *)local_258);
      params_1 = "\"failed: expected \" \"(11) == (reader.size())\", 11, reader.size()";
      kj::_::Debug::log<char_const(&)[41],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x572,ERROR,"\"failed: expected \" \"(11) == (reader.size())\", 11, reader.size()"
                 ,(char (*) [41])"failed: expected (11) == (reader.size())",(int *)&i_2,&local_264);
      local_259 = false;
    }
  }
  local_268[0] = '\0';
  local_268[1] = '\0';
  local_268[2] = '\0';
  local_268[3] = '\0';
  for (; (uint)local_268 < 7; local_268 = (char  [4])((int)local_268 + 1)) {
    kj::str<char_const(&)[4],unsigned_int&>(&local_280,(kj *)"foo",&local_268,(uint *)params_1);
    RVar7 = List<capnp::Text,_(capnp::Kind)1>::Reader::operator[]
                      ((Reader *)local_258,(uint)local_268);
    local_288 = RVar7.super_StringPtr.content.size_;
    params_1 = RVar7.super_StringPtr.content.ptr;
    _auStack_290 = (uint *)params_1;
    bVar1 = kj::String::operator==(&local_280,(StringPtr *)auStack_290);
    kj::String::~String(&local_280);
    if (!bVar1) {
      local_291 = kj::_::Debug::shouldLog(ERROR);
      while (local_291 != false) {
        kj::str<char_const(&)[4],unsigned_int&>(&local_2b0,(kj *)"foo",&local_268,(uint *)params_1);
        AVar8 = (ArrayPtr<const_char>)
                List<capnp::Text,_(capnp::Kind)1>::Reader::operator[]
                          ((Reader *)local_258,(uint)local_268);
        params_1 = 
        "\"failed: expected \" \"(kj::str(\\\"foo\\\", i)) == (reader[i])\", kj::str(\"foo\", i), reader[i]"
        ;
        local_2c0 = AVar8;
        kj::_::Debug::log<char_const(&)[52],kj::String,capnp::Text::Reader>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0x575,ERROR,
                   "\"failed: expected \" \"(kj::str(\\\"foo\\\", i)) == (reader[i])\", kj::str(\"foo\", i), reader[i]"
                   ,(char (*) [52])"failed: expected (kj::str(\"foo\", i)) == (reader[i])",
                   &local_2b0,(Reader *)&local_2c0);
        kj::String::~String(&local_2b0);
        local_291 = false;
      }
    }
    List<capnp::Text,_(capnp::Kind)1>::Builder::operator[]
              ((Builder *)&i_3,(Builder *)local_1e0,(uint)local_268);
    bVar1 = Text::Builder::operator==((Builder *)&i_3,(void *)0x0);
    if (!bVar1) {
      local_2d9 = kj::_::Debug::shouldLog(ERROR);
      while (local_2d9 != false) {
        params_1 = "\"failed: expected \" \"builder[i] == nullptr\"";
        kj::_::Debug::log<char_const(&)[39]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0x576,ERROR,"\"failed: expected \" \"builder[i] == nullptr\"",
                   (char (*) [39])"failed: expected builder[i] == nullptr");
        local_2d9 = false;
      }
    }
  }
  for (local_2e0 = 7; local_2e0 < 0xb; local_2e0 = local_2e0 + 1) {
    AVar8 = (ArrayPtr<const_char>)
            List<capnp::Text,_(capnp::Kind)1>::Reader::operator[]((Reader *)local_258,local_2e0);
    _auStack_2f0 = AVar8;
    bVar1 = kj::StringPtr::operator==((StringPtr *)auStack_2f0,(void *)0x0);
    if (!bVar1) {
      local_2f1 = kj::_::Debug::shouldLog(ERROR);
      while (local_2f1 != false) {
        kj::_::Debug::log<char_const(&)[38]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0x579,ERROR,"\"failed: expected \" \"reader[i] == nullptr\"",
                   (char (*) [38])"failed: expected reader[i] == nullptr");
        local_2f1 = false;
      }
    }
  }
  Text::Reader::Reader((Reader *)&local_308,"bar");
  List<capnp::Text,_(capnp::Kind)1>::Builder::set((Builder *)local_1e0,0,(Reader)local_308);
  _auStack_318 = (ArrayPtr<const_char>)
                 List<capnp::Text,_(capnp::Kind)1>::Reader::operator[]((Reader *)local_258,0);
  bVar1 = kj::operator==("foo0",(StringPtr *)auStack_318);
  if (!bVar1) {
    local_319 = kj::_::Debug::shouldLog(ERROR);
    while (local_319 != false) {
      AVar8 = (ArrayPtr<const_char>)
              List<capnp::Text,_(capnp::Kind)1>::Reader::operator[]((Reader *)local_258,0);
      local_330 = AVar8;
      kj::_::Debug::log<char_const(&)[41],char_const(&)[5],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x57f,ERROR,
                 "\"failed: expected \" \"(\\\"foo0\\\") == (reader[0])\", \"foo0\", reader[0]",
                 (char (*) [41])"failed: expected (\"foo0\") == (reader[0])",(char (*) [5])"foo0",
                 (Reader *)&local_330);
      local_319 = false;
    }
  }
  _auStack_340 = (ArrayPtr<const_unsigned_char>)
                 Orphan<capnp::Data>::getReader((Orphan<capnp::Data> *)local_208);
  puVar4 = kj::ArrayPtr<const_unsigned_char>::operator[]
                     ((ArrayPtr<const_unsigned_char> *)auStack_340,0);
  if (*puVar4 != ' ') {
    local_341 = kj::_::Debug::shouldLog(ERROR);
    while (local_341 != false) {
      local_348 = 0x20;
      AVar9 = (ArrayPtr<const_unsigned_char>)
              Orphan<capnp::Data>::getReader((Orphan<capnp::Data> *)local_208);
      local_358 = AVar9;
      puVar4 = kj::ArrayPtr<const_unsigned_char>::operator[](&local_358,0);
      kj::_::Debug::log<char_const(&)[50],int,unsigned_char_const&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x581,ERROR,
                 "\"failed: expected \" \"(32) == (orphan2.getReader()[0])\", 32, orphan2.getReader()[0]"
                 ,(char (*) [50])"failed: expected (32) == (orphan2.getReader()[0])",&local_348,
                 puVar4);
      local_341 = false;
    }
  }
  Orphan<capnp::Data>::~Orphan((Orphan<capnp::Data> *)local_208);
  Orphan<capnp::List<capnp::Text,_(capnp::Kind)1>_>::~Orphan
            ((Orphan<capnp::List<capnp::Text,_(capnp::Kind)1>_> *)local_1a8);
  kj::Vector<capnp::Orphan<capnp::Text>_>::~Vector((Vector<capnp::Orphan<capnp::Text>_> *)local_120)
  ;
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&pointers.builder.disposer);
  return;
}

Assistant:

TEST(Orphans, ExtendPointerListCopy) {
  MallocMessageBuilder message;

  // Allocate data in advance so that the list itself is at the end of the segment.
  kj::Vector<Orphan<Text>> pointers(7);
  for (uint i = 0; i < 7; i++) {
    pointers.add(message.getOrphanage().newOrphanCopy(Text::Reader(kj::str("foo", i))));
  }

  auto orphan = message.getOrphanage().newOrphan<List<Text>>(7);
  auto builder = orphan.get();
  for (uint i = 0; i < 7; i++) {
    builder.adopt(i, kj::mv(pointers[i]));
  }

  auto orphan2 = message.getOrphanage().newOrphan<Data>(1);
  orphan2.get()[0] = 32;

  orphan.truncate(11);

  auto reader = orphan.getReader();
  EXPECT_EQ(11, reader.size());

  for (uint i = 0; i < 7; i++) {
    EXPECT_EQ(kj::str("foo", i), reader[i]);
    EXPECT_TRUE(builder[i] == nullptr);
  }
  for (uint i = 7; i < 11; i++) {
    EXPECT_TRUE(reader[i] == nullptr);
  }

  // Can't compare pointers directly, but we can check if builder modifications are visible using
  // the reader.
  builder.set(0, "bar");
  EXPECT_EQ("foo0", reader[0]);

  EXPECT_EQ(32, orphan2.getReader()[0]);
}